

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan
               (SwitchProcessor *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_SwitchProcessor_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00d15e8b:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_00d15ac0:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00d15e8b;
    }
    local_38 = pEVar1 + 2;
    local_40 = ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
                  *)&(self->
                     super_ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>
                     ).super_PostWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.
                     super_Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    goto LAB_00d15909;
  case LoopId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d153e4;
  case BreakId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00d15e8b;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
                  *)&(self->
                     super_ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>
                     ).super_PostWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.
                     super_Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00d15248;
  case SwitchId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x00d15242;
  case CallId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00d15e8b;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitCallIndirect,
               currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitLocalGet,currp
              );
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00d15e8b;
    }
    break;
  case LocalSetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitLocalSet,currp
              );
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d159fb;
  case GlobalGetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitGlobalGet,
               currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00d15e8b;
    }
    break;
  case GlobalSetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitGlobalSet,
               currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d153e4;
  case LoadId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00d15e8b;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00d15a09;
  case StoreId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d156a8;
  case ConstId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00d15e8b;
    }
    break;
  case UnaryId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d159fb;
  case BinaryId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1563f;
  case SelectId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d158fa;
  case DropId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case ReturnId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15239;
  case MemorySizeId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitMemorySize,
               currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00d15e8b;
    }
    break;
  case MemoryGrowId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitMemoryGrow,
               currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case NopId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00d15e8b;
    }
    break;
  case UnreachableId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitUnreachable,
               currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00d15e8b;
    }
    break;
  case AtomicRMWId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitAtomicRMW,
               currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1572b;
  case AtomicCmpxchgId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitAtomicCmpxchg,
               currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1571c;
  case AtomicWaitId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitAtomicWait,
               currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15405;
  case AtomicNotifyId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitAtomicNotify,
               currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1563f;
  case AtomicFenceId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitAtomicFence,
               currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00d15e8b;
    }
    break;
  case SIMDExtractId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSIMDExtract,
               currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d159fb;
  case SIMDReplaceId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSIMDReplace,
               currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00d15e8b;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00d1564a;
  case SIMDShuffleId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSIMDShuffle,
               currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15909;
  case SIMDTernaryId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSIMDTernary,
               currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15405;
  case SIMDShiftId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSIMDShift,
               currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1563f;
  case SIMDLoadId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSIMDLoad,currp
              );
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d155c4;
  case SIMDLoadStoreLaneId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00d15e8b;
    }
LAB_00d156a8:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00d15a09;
  case MemoryInitId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitMemoryInit,
               currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1571c;
  case DataDropId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitDataDrop,currp
              );
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00d15e8b;
    }
    break;
  case MemoryCopyId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitMemoryCopy,
               currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d158fa;
  case MemoryFillId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitMemoryFill,
               currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d158fa;
  case PopId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00d15e8b;
    }
    break;
  case RefNullId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefNull,currp)
    ;
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00d15e8b;
    }
    break;
  case RefIsNullId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefIsNull,
               currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case RefFuncId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefFunc,currp)
    ;
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00d15e8b;
    }
    break;
  case RefEqId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15909;
  case TableGetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTableGet,currp
              );
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d153e4;
  case TableSetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTableSet,currp
              );
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1572b;
  case TableSizeId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTableSize,
               currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00d15e8b;
    }
    break;
  case TableGrowId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTableGrow,
               currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1572b;
  case TableFillId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTableFill,
               currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1571c;
  case TableCopyId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTableCopy,
               currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d158fa;
  case TableInitId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTableInit,
               currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1571c;
  case TryId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00d15e8b;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_00d153e4:
    pEVar1 = pEVar1 + 2;
    goto LAB_00d15a09;
  case TryTableId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTryTable,currp
              );
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case ThrowId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00d15e8b;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRethrow,currp)
    ;
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00d15e8b;
    }
    break;
  case ThrowRefId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitThrowRef,currp
              );
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case TupleMakeId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTupleMake,
               currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00d15e8b;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitTupleExtract,
               currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case RefI31Id:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case I31GetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case CallRefId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitCallRef,currp)
    ;
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefTest,currp)
    ;
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case RefCastId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefCast,currp)
    ;
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case BrOnId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00d15e8b;
    }
LAB_00d155c4:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00d15a09;
  case StructNewId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStructNew,
               currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00d15e8b;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStructGet,
               currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d159fb;
  case StructSetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStructSet,
               currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1563f;
  case StructRMWId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStructRMW,
               currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1563f;
  case StructCmpxchgId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStructCmpxchg,
               currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_00d15e8b;
    }
LAB_00d15405:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00d1564a;
  case ArrayNewId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayNew,currp
              );
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[1].type);
LAB_00d15239:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x00d15242:
    if (lVar5 != 0) {
LAB_00d15248:
      local_40 = ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan
      ;
      SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
                  *)&(self->
                     super_ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>
                     ).super_PostWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.
                     super_Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayNewData,
               currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1572b;
  case ArrayNewElemId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayNewElem,
               currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d1572b;
  case ArrayNewFixedId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayNewFixed,
               currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00d15e8b;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayGet,currp
              );
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15909;
  case ArraySetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArraySet,currp
              );
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d158fa;
  case ArrayLenId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayLen,currp
              );
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d154a0;
  case ArrayCopyId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayCopy,
               currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00d158eb;
  case ArrayFillId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayFill,
               currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00d15e8b;
    }
LAB_00d158eb:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_00d158fa;
  case ArrayInitDataId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayInitData,
               currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d14d30;
  case ArrayInitElemId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitArrayInitElem,
               currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_00d15e8b;
    }
LAB_00d14d30:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[3].type);
LAB_00d1571c:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 3));
LAB_00d1572b:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00d15a09;
  case RefAsId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d159fb;
  case StringNewId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringNew,
               currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00d15e8b;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
                  *)&(self->
                     super_ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>
                     ).super_PostWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.
                     super_Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
                  *)&(self->
                     super_ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>
                     ).super_PostWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.
                     super_Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    goto LAB_00d159fb;
  case StringConstId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringConst,
               currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00d15e8b;
    }
    break;
  case StringMeasureId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringMeasure,
               currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00d15e8b;
    }
LAB_00d159fb:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00d15a09;
  case StringEncodeId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringEncode,
               currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00d15e8b;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,wasm::Visitor<wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::SwitchProcessor,void>>::Task,10ul>
                  *)&(self->
                     super_ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>
                     ).super_PostWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.
                     super_Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    goto LAB_00d1563f;
  case StringConcatId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringConcat,
               currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15909;
  case StringEqId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringEq,currp
              );
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00d15e8b;
    }
LAB_00d1563f:
    currp_00 = pEVar1 + 2;
LAB_00d1564a:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00d15a09;
  case StringWTF16GetId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringWTF16Get
               ,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00d15e8b;
    }
    goto LAB_00d15909;
  case StringSliceWTFId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStringSliceWTF
               ,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00d15e8b;
    }
LAB_00d158fa:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 2));
LAB_00d15909:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00d15a09;
  case ContNewId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitContNew,currp)
    ;
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_00d15e8b;
    }
LAB_00d154a0:
    pEVar1 = pEVar1 + 1;
LAB_00d15a09:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)pEVar1);
    return;
  case ContBindId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitContBind,currp
              );
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case SuspendId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitSuspend,currp)
    ;
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_00d15e8b;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[5].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 5) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeThrowId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitResumeThrow,
               currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[6].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 6) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StackSwitchId:
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::doVisitStackSwitch,
               currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_00d15e8b;
    }
    Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
              ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
               ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::scan,
               (Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00d15ac0;
        Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::pushTask
                  ((Walker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_> *)self,
                   ExpressionStackWalker<SwitchProcessor,_wasm::Visitor<SwitchProcessor,_void>_>::
                   scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }